

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O1

void __thiscall
r_exec::CmdGuardBuilder::_build
          (CmdGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uint16_t uVar6;
  uint16_t uVar7;
  undefined6 in_register_0000000a;
  uint uVar8;
  undefined6 in_register_00000012;
  TimingGuardBuilder *pTVar9;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  undefined1 local_60 [6];
  uint16_t extent_index;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint16_t local_48;
  uint16_t local_46;
  undefined4 local_44;
  undefined4 local_40;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  
  local_4c = (uint)CONCAT62(in_register_0000008a,t0);
  local_58 = (uint)CONCAT62(in_register_00000012,fwd_opcode);
  iVar3 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar5 + 0x20))(plVar5,2);
  uVar2 = r_code::Atom::asIndex();
  local_54 = CONCAT22(local_54._2_2_,uVar2);
  (**(code **)(*plVar5 + 0x20))(plVar5,3);
  uVar2 = r_code::Atom::asIndex();
  local_50 = CONCAT22(local_50._2_2_,uVar2);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5,0);
  (**(code **)(*plVar5 + 0x20))(plVar5,3);
  local_40 = r_code::Atom::asIndex();
  iVar3 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
  (**(code **)(*plVar5 + 0x20))(plVar5,2);
  local_48 = r_code::Atom::asIndex();
  (**(code **)(*plVar5 + 0x20))(plVar5,3);
  local_46 = r_code::Atom::asIndex();
  plVar5 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5,0);
  (**(code **)(*plVar5 + 0x20))(plVar5,this->cmd_arg_index);
  uVar4 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_60);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar3),(Atom *)local_60);
  local_34 = (uint)CONCAT62(in_register_00000082,q0);
  local_38 = (undefined4)CONCAT62(in_register_0000000a,bwd_opcode);
  local_44 = uVar4;
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::Set((uchar)local_60);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar3),(Atom *)local_60);
  pTVar9 = (TimingGuardBuilder *)local_60;
  r_code::Atom::~Atom((Atom *)pTVar9);
  extent_index = *write_index + 3;
  uVar6 = (uint16_t)local_54;
  uVar7 = (uint16_t)local_4c;
  uVar8 = local_54 & 0xffff;
  local_54 = local_4c & 0xffff;
  local_4c = uVar8;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,uVar6,uVar7,Opcodes::Add,(this->super_TimingGuardBuilder).period,write_index
             ,&extent_index);
  uVar6 = (uint16_t)local_50;
  local_50 = local_50 & 0xffff;
  local_3c = (uint)t1;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,uVar6,t1,Opcodes::Add,(this->super_TimingGuardBuilder).period,write_index,
             &extent_index);
  uVar7 = extent_index;
  uVar1 = extent_index + 1;
  extent_index = uVar1;
  r_code::Atom::AssignmentPointer((uchar)local_60,(ushort)(byte)local_40);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::Operator((ushort)local_60,(uchar)local_58);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  uVar8 = local_34;
  uVar4 = local_44;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::VLPointer((ushort)local_60,(ushort)uVar8);
  extent_index = uVar7 + 2;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::VLPointer((ushort)local_60,(ushort)uVar4);
  extent_index = uVar7 + 3;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  extent_index = uVar7 + 4;
  *write_index = extent_index;
  *write_index = uVar7 + 5;
  r_code::Atom::IPointer((ushort)local_60);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar3),(Atom *)local_60);
  local_58 = uVar8 & 0xffff;
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::Set((uchar)local_60);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar3),(Atom *)local_60);
  pTVar9 = (TimingGuardBuilder *)local_60;
  r_code::Atom::~Atom((Atom *)pTVar9);
  extent_index = *write_index + 5;
  uVar6 = (uint16_t)local_4c;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,(uint16_t)local_54,uVar6,Opcodes::Sub,
             (this->super_TimingGuardBuilder).period,write_index,&extent_index);
  uVar7 = (uint16_t)local_50;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,(uint16_t)local_3c,uVar7,Opcodes::Sub,
             (this->super_TimingGuardBuilder).period,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,local_48,uVar6,Opcodes::Sub,(this->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,local_46,uVar7,Opcodes::Sub,(this->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  uVar7 = extent_index;
  uVar1 = extent_index + 1;
  extent_index = uVar1;
  r_code::Atom::AssignmentPointer((uchar)local_60,(ushort)(byte)local_44);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::Operator((ushort)local_60,(uchar)local_38);
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::VLPointer((ushort)local_60,(ushort)local_40);
  extent_index = uVar7 + 2;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  r_code::Atom::VLPointer((ushort)local_60,(ushort)local_58);
  extent_index = uVar7 + 3;
  iVar3 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar3),(Atom *)local_60);
  r_code::Atom::~Atom((Atom *)local_60);
  *write_index = uVar7 + 4;
  return;
}

Assistant:

void CmdGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t cmd_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t cmd_t1 = lhs->code(FACT_BEFORE).asIndex();
    uint16_t cmd_arg = lhs->get_reference(0)->code(cmd_arg_index).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 cmd_arg)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::VLPointer(cmd_arg);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t1, t3, Opcodes::Sub, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(cmd_arg, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // cmd_arg:(bwd_opcode q1 q0)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    extent_index += 1;
    write_index = extent_index;
}